

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8 * google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItemsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target)

{
  pointer pUVar1;
  bool bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  uint uVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  uint uVar7;
  long lVar8;
  
  pvVar6 = unknown_fields->fields_;
  if (pvVar6 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    lVar8 = 0;
    do {
      pUVar1 = (pvVar6->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(pvVar6->
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4) <=
          lVar8) {
        return target;
      }
      if (pUVar1[lVar8].type_ == 3) {
        target[0] = '\v';
        target[1] = '\x10';
        pbVar3 = target + 2;
        uVar7 = pUVar1[lVar8].number_;
        uVar5 = uVar7;
        if (0x7f < uVar7) {
          do {
            *pbVar3 = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            pbVar3 = pbVar3 + 1;
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar2);
        }
        *pbVar3 = (byte)uVar5;
        pbVar3[1] = 0x1a;
        puVar4 = UnknownField::SerializeLengthDelimitedNoTagToArray(pUVar1 + lVar8,pbVar3 + 2);
        *puVar4 = '\f';
        target = puVar4 + 1;
        pvVar6 = unknown_fields->fields_;
      }
      lVar8 = lVar8 + 1;
    } while (pvVar6 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        *)0x0);
  }
  return target;
}

Assistant:

uint8* WireFormat::SerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields,
    uint8* target) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target = io::CodedOutputStream::WriteVarint32ToArray(
          field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);
      target = field.SerializeLengthDelimitedNoTagToArray(target);

      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}